

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s2_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  pointer pfVar16;
  void *pvVar17;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  char *pcVar29;
  char *pcVar30;
  long lVar31;
  char *pcVar32;
  int iVar33;
  float *pfVar34;
  uint uVar35;
  undefined1 auVar36 [16];
  undefined4 uVar37;
  undefined1 auVar38 [16];
  int iVar40;
  undefined1 auVar39 [16];
  int remain;
  
  auVar24 = _DAT_001752f0;
  auVar23 = _DAT_001752e0;
  auVar22 = _DAT_001752d0;
  iVar11 = top_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    iVar13 = top_blob->h;
    iVar14 = bottom_blob->w;
    iVar21 = (iVar14 - iVar12) * 2;
    pvVar15 = top_blob->data;
    lVar26 = top_blob->cstep * top_blob->elemsize;
    uVar25 = iVar13 * iVar12;
    pfVar16 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pvVar17 = bottom_blob->data;
    sVar18 = bottom_blob->cstep;
    sVar19 = bottom_blob->elemsize;
    lVar27 = (ulong)uVar25 - 1;
    auVar36._8_4_ = (int)lVar27;
    auVar36._0_8_ = lVar27;
    auVar36._12_4_ = (int)((ulong)lVar27 >> 0x20);
    lVar27 = (long)pvVar15 + 0xc;
    lVar31 = 0;
    auVar36 = auVar36 ^ _DAT_001752d0;
    do {
      if (_bias == (Mat *)0x0) {
        uVar37 = 0;
      }
      else {
        uVar37 = *(undefined4 *)((long)&_bias->data + lVar31 * 4);
      }
      fVar7 = pfVar16[lVar31];
      if (0 < (int)uVar25) {
        uVar28 = 0;
        do {
          auVar38._8_4_ = (int)uVar28;
          auVar38._0_8_ = uVar28;
          auVar38._12_4_ = (int)(uVar28 >> 0x20);
          auVar39 = (auVar38 | auVar24) ^ auVar22;
          iVar33 = auVar36._4_4_;
          if ((bool)(~(iVar33 < auVar39._4_4_ ||
                      auVar36._0_4_ < auVar39._0_4_ && auVar39._4_4_ == iVar33) & 1)) {
            *(undefined4 *)(lVar27 + -0xc + uVar28 * 4) = uVar37;
          }
          if (auVar39._12_4_ <= auVar36._12_4_ &&
              (auVar39._8_4_ <= auVar36._8_4_ || auVar39._12_4_ != auVar36._12_4_)) {
            *(undefined4 *)(lVar27 + -8 + uVar28 * 4) = uVar37;
          }
          auVar38 = (auVar38 | auVar23) ^ auVar22;
          iVar40 = auVar38._4_4_;
          if (iVar40 <= iVar33 && (iVar40 != iVar33 || auVar38._0_4_ <= auVar36._0_4_)) {
            *(undefined4 *)(lVar27 + -4 + uVar28 * 4) = uVar37;
            *(undefined4 *)(lVar27 + uVar28 * 4) = uVar37;
          }
          uVar28 = uVar28 + 4;
        } while ((uVar25 + 3 & 0xfffffffc) != uVar28);
      }
      if (0 < iVar13) {
        pfVar34 = (float *)(lVar26 * lVar31 + (long)pvVar15);
        lVar20 = lVar31 * 9;
        pcVar29 = (char *)(sVar18 * sVar19 * lVar31 + (long)pvVar17);
        pcVar32 = pcVar29 + (long)iVar14 * 2;
        pcVar30 = pcVar29 + iVar14;
        iVar33 = 0;
        do {
          uVar35 = iVar12 + 1;
          if (0 < iVar12) {
            do {
              cVar8 = *pcVar29;
              pcVar1 = pcVar29 + 1;
              pcVar2 = pcVar29 + 2;
              pcVar29 = pcVar29 + 2;
              cVar9 = *pcVar30;
              pcVar3 = pcVar30 + 1;
              pcVar4 = pcVar30 + 2;
              pcVar30 = pcVar30 + 2;
              cVar10 = *pcVar32;
              pcVar5 = pcVar32 + 1;
              pcVar6 = pcVar32 + 2;
              pcVar32 = pcVar32 + 2;
              *pfVar34 = (float)((int)*(char *)((long)&_kernel->refcount + lVar20) * (int)*pcVar6 +
                                 (int)*(char *)((long)&_kernel->data + lVar20 + 7) * (int)*pcVar5 +
                                (int)*(char *)((long)&_kernel->data + lVar20 + 6) * (int)cVar10 +
                                (int)*(char *)((long)&_kernel->data + lVar20 + 5) * (int)*pcVar4 +
                                (int)*(char *)((long)&_kernel->data + lVar20 + 4) * (int)*pcVar3 +
                                (int)*(char *)((long)&_kernel->data + lVar20 + 3) * (int)cVar9 +
                                (int)*(char *)((long)&_kernel->data + lVar20 + 2) * (int)*pcVar2 +
                                (int)*(char *)((long)&_kernel->data + lVar20 + 1) * (int)*pcVar1 +
                                (int)*(char *)((long)&_kernel->data + lVar20) * (int)cVar8) * fVar7
                         + *pfVar34;
              pfVar34 = pfVar34 + 1;
              uVar35 = uVar35 - 1;
            } while (1 < uVar35);
          }
          pcVar29 = pcVar29 + iVar21;
          pcVar30 = pcVar30 + iVar21;
          pcVar32 = pcVar32 + iVar21;
          iVar33 = iVar33 + 1;
        } while (iVar33 != iVar13);
      }
      lVar31 = lVar31 + 1;
      lVar27 = lVar27 + lVar26;
    } while (lVar31 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char *kernel0 = (const signed char *)kernel + p * 9;
        
        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}